

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O2

PyObject *
boost::python::objects::
class_cref_wrapper<HFParsingInfo,_boost::python::objects::make_instance<HFParsingInfo,_boost::python::objects::value_holder<HFParsingInfo>_>_>
::convert(HFParsingInfo *x)

{
  PyObject *pPVar1;
  reference_wrapper<const_HFParsingInfo> local_8;
  
  local_8.t_ = x;
  pPVar1 = make_instance_impl<HFParsingInfo,boost::python::objects::value_holder<HFParsingInfo>,boost::python::objects::make_instance<HFParsingInfo,boost::python::objects::value_holder<HFParsingInfo>>>
           ::execute<boost::reference_wrapper<HFParsingInfo_const>const>(&local_8);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }